

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_free(Parser *this)

{
  long in_RDI;
  stack<c4::yml::Parser::State,_16UL> *in_stack_00000060;
  
  if (*(long *)(in_RDI + 0xa88) != 0) {
    (**(code **)(in_RDI + 0x9e0))
              (*(undefined8 *)(in_RDI + 0xa88),*(long *)(in_RDI + 0xa98) << 3,
               *(undefined8 *)(in_RDI + 0x9d0));
    *(undefined8 *)(in_RDI + 0xa88) = 0;
    *(undefined8 *)(in_RDI + 0xa88) = 0;
    *(undefined8 *)(in_RDI + 0xa90) = 0;
    *(undefined8 *)(in_RDI + 0xa98) = 0;
    basic_substring<const_char>::operator=
              ((basic_substring<const_char> *)(in_RDI + 0xaa0),(nullptr_t)0x0);
  }
  if (*(long *)(in_RDI + 0xa80) != 0) {
    (**(code **)(in_RDI + 0x9e0))
              (*(undefined8 *)(in_RDI + 0xa78),*(undefined8 *)(in_RDI + 0xa80),
               *(undefined8 *)(in_RDI + 0x9d0));
    *(undefined8 *)(in_RDI + 0xa78) = 0;
    basic_substring<char>::operator=((basic_substring<char> *)(in_RDI + 0xa78),(nullptr_t)0x0);
  }
  detail::stack<c4::yml::Parser::State,_16UL>::_free(in_stack_00000060);
  return;
}

Assistant:

void Parser::_free()
{
    if(m_newline_offsets)
    {
        _RYML_CB_FREE(m_stack.m_callbacks, m_newline_offsets, size_t, m_newline_offsets_capacity);
        m_newline_offsets = nullptr;
        m_newline_offsets_size = 0u;
        m_newline_offsets_capacity = 0u;
        m_newline_offsets_buf = 0u;
    }
    if(m_filter_arena.len)
    {
        _RYML_CB_FREE(m_stack.m_callbacks, m_filter_arena.str, char, m_filter_arena.len);
        m_filter_arena = {};
    }
    m_stack._free();
}